

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_optimizeRational(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,bool *interrupt)

{
  Status SVar1;
  bool bVar2;
  Verbosity VVar3;
  SPxStatus SVar4;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SolRational *sol;
  Real RVar5;
  Verbosity old_verbosity_17;
  Verbosity old_verbosity_16;
  Verbosity old_verbosity_15;
  Verbosity old_verbosity_14;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  Verbosity old_verbosity_10;
  Verbosity old_verbosity_9;
  SolRational solUnbounded_1;
  Verbosity old_verbosity_8;
  Verbosity old_verbosity_7;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  SolRational solUnbounded;
  bool error;
  bool unbounded;
  bool infeasible;
  bool dualFeasible;
  bool primalFeasible;
  bool stoppedIter;
  bool stoppedTime;
  int oldRatiotester;
  int oldRepresentation;
  Verbosity old_verbosity;
  bool unboundednessNotCertified;
  bool infeasibilityNotCertified;
  bool hasUnboundedRay;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000d90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc08;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *vec;
  SPxStatus stat;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc10;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc18;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc20;
  VarStatus *in_stack_fffffffffffffc28;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc30;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc40;
  bool *in_stack_fffffffffffffc48;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  undefined4 in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc54;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffc58;
  SolRational *in_stack_fffffffffffffc60;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc68;
  VarStatus *in_stack_fffffffffffffc80;
  VarStatus *in_stack_fffffffffffffc88;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc90;
  bool *in_stack_fffffffffffffc98;
  bool *in_stack_fffffffffffffca0;
  bool *in_stack_fffffffffffffca8;
  bool *in_stack_fffffffffffffcb8;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcc8;
  undefined1 init;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_stack_fffffffffffffcd0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffcd8;
  SolRational *in_stack_fffffffffffffce0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffce8;
  Verbosity local_300;
  Verbosity local_2fc [3];
  Verbosity local_2f0;
  Verbosity local_2ec [3];
  Verbosity local_2e0;
  Verbosity local_2dc [3];
  Verbosity local_2d0;
  Verbosity local_2cc [37];
  SolRational *in_stack_fffffffffffffdc8;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdd0;
  SolRational *in_stack_fffffffffffffdd8;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffde0;
  byte local_1e8;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffef0;
  undefined1 local_a5 [2];
  byte local_a3;
  byte local_a2;
  byte local_a1;
  int local_a0;
  int local_9c;
  Real local_98;
  undefined1 local_8c [80];
  Verbosity local_3c;
  Verbosity local_38;
  undefined1 local_33;
  byte local_32;
  bool local_31;
  undefined8 local_20;
  Real *local_18;
  undefined1 *local_10;
  Real *local_8;
  
  local_31 = false;
  local_32 = 0;
  local_33 = 0;
  (*in_RDI->_statistics->solvingTime->_vptr_Timer[3])();
  (*in_RDI->_statistics->preprocessingTime->_vptr_Timer[3])();
  (*in_RDI->_statistics->initialPrecisionTime->_vptr_Timer[3])();
  in_RDI->_lastSolveMode = 2;
  _resetBoostedPrecision(in_RDI);
  if ((in_RDI->_isRealLPLoaded & 1U) == 0) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::loadLP(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             SUB81((ulong)in_stack_fffffffffffffc10 >> 0x38,0));
    spx_free<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              ((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)0x60f468);
    in_RDI->_realLP =
         &(in_RDI->_solver).
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    in_RDI->_isRealLPLoaded = true;
  }
  else if ((in_RDI->_hasBasis & 1U) != 0) {
    in_stack_fffffffffffffcc8 =
         (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)&in_RDI->_basisStatusRows;
    numRows((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x60f4c0);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
              *)in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    in_stack_fffffffffffffcd0 = &in_RDI->_basisStatusCols;
    numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x60f4ed);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
              *)in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    in_stack_fffffffffffffcd8 =
         (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)&in_RDI->_solver;
    in_stack_fffffffffffffce0 =
         (SolRational *)
         DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
         ::get_ptr(&in_RDI->_basisStatusRows);
    in_stack_fffffffffffffce8 =
         (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
            ::get_ptr(&in_RDI->_basisStatusCols);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::size(&in_RDI->_basisStatusRows);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::size(&in_RDI->_basisStatusCols);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBasis(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
               (VarStatus *)in_stack_fffffffffffffc20,
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20),(int)in_stack_fffffffffffffc18);
  }
  _storeLPReal(in_stack_fffffffffffffc10);
  sol = (SolRational *)realParam(in_RDI,OBJLIMIT_LOWER);
  RVar5 = realParam(in_RDI,INFTY);
  if ((double)sol <= -RVar5) {
    in_stack_fffffffffffffcb8 = (bool *)realParam(in_RDI,OBJLIMIT_UPPER);
    RVar5 = realParam(in_RDI,INFTY);
    if (RVar5 <= (double)in_stack_fffffffffffffcb8) goto LAB_0060f6e3;
  }
  if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0xfffffffffffffff8) &&
     (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 3 < (int)VVar3)) {
    local_38 = SPxOut::getVerbosity(&in_RDI->spxout);
    local_3c = INFO2;
    SPxOut::setVerbosity(&in_RDI->spxout,&local_3c);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08);
    SPxOut::setVerbosity(&in_RDI->spxout,&local_38);
  }
LAB_0060f6e3:
  pSVar6 = &in_RDI->_solver;
  local_98 = realParam(in_RDI,INFTY);
  local_10 = local_8c;
  local_18 = &local_98;
  local_20 = 0;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffc20,
             (double)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTerminationValue
            ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  (*in_RDI->_statistics->preprocessingTime->_vptr_Timer[4])();
  bVar2 = boolParam(in_RDI,LIFTING);
  if (bVar2) {
    _lift(in_stack_00000d90);
  }
  local_9c = intParam(in_RDI,REPRESENTATION);
  setIntParam(in_stack_fffffffffffffcd8,(IntParam)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
              (int)in_stack_fffffffffffffcd0,SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0));
  local_a0 = intParam(in_RDI,RATIOTESTER);
  if (local_a0 == 3) {
    setIntParam(in_stack_fffffffffffffcd8,(IntParam)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                (int)in_stack_fffffffffffffcd0,SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0));
  }
  bVar2 = boolParam(in_RDI,EQTRANS);
  if (bVar2) {
    _transformEquality(in_stack_fffffffffffffef0);
  }
  in_RDI->_storedBasis = false;
  do {
    local_a3 = 0;
    local_a5[1] = 0;
    local_a5[0] = 0;
    local_a1 = 0;
    local_a2 = 0;
    _switchToStandardMode(in_RDI);
    this_01 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)local_a5;
    vec = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)(local_a5 + 1);
    _performOptIRWrapper
              (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,
               SUB81((ulong)in_stack_fffffffffffffc58 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffc58 >> 0x30,0),(int)in_stack_fffffffffffffc58,
               (bool *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (bool *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc98,in_stack_fffffffffffffca0
               ,in_stack_fffffffffffffca8,(bool *)pSVar6,in_stack_fffffffffffffcb8);
    if ((local_a1 & 1) != 0) {
      in_RDI->_status = ABORT_TIME;
      break;
    }
    if ((local_a2 & 1) != 0) {
      in_RDI->_status = ABORT_ITER;
      break;
    }
    if (((local_a5[0] & 1) == 0) || ((local_32 & 1) != 0)) {
      if (((local_a3 & 1) == 0) || ((local_a5[1] & 1) == 0)) {
        if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0xfffffffffffffff8) &&
           (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
          local_2fc[0] = SPxOut::getVerbosity(&in_RDI->spxout);
          local_300 = INFO1;
          SPxOut::setVerbosity(&in_RDI->spxout,&local_300);
          soplex::operator<<((SPxOut *)this_01,(char *)vec);
          SPxOut::setVerbosity(&in_RDI->spxout,local_2fc);
        }
      }
      else {
        if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0xfffffffffffffff8) &&
           (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
          local_2fc[2] = SPxOut::getVerbosity(&in_RDI->spxout);
          local_2fc[1] = 3;
          SPxOut::setVerbosity(&in_RDI->spxout,local_2fc + 1);
          soplex::operator<<((SPxOut *)this_01,(char *)vec);
          SPxOut::setVerbosity(&in_RDI->spxout,local_2fc + 2);
        }
        in_RDI->_status = OPTIMAL;
      }
      break;
    }
    _storeBasis(this_01);
    _switchToFeasMode(in_RDI);
    _performFeasIRStable
              (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,(bool *)in_stack_fffffffffffffcd8
               ,(bool *)in_stack_fffffffffffffcd0,(bool *)in_stack_fffffffffffffcc8,(bool *)sol);
    local_32 = (local_a5[0] ^ 0xff) & 1;
    if ((local_a1 & 1) != 0) {
      in_RDI->_status = ABORT_TIME;
      _restoreBasis(this_01);
      break;
    }
    if ((local_a2 & 1) != 0) {
      in_RDI->_status = ABORT_ITER;
      _restoreBasis(this_01);
      break;
    }
    if (((local_a5[0] & 1) != 0) && (bVar2 = boolParam(in_RDI,TESTDUALINF), bVar2)) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::SolBase(in_stack_fffffffffffffc58);
      _switchToUnbdMode(in_RDI);
      _performUnboundedIRStable
                (in_stack_fffffffffffffcc8,sol,in_stack_fffffffffffffcb8,(bool *)pSVar6,
                 in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      if ((local_31 & 1U) == 0) {
        if ((local_1e8 >> 2 & 1) == 0) {
          if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0xfffffffffffffff8) &&
             (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
            in_stack_fffffffffffffc58 =
                 (SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)&in_RDI->spxout;
            local_2dc[2] = SPxOut::getVerbosity((SPxOut *)in_stack_fffffffffffffc58);
            local_2dc[1] = 3;
            SPxOut::setVerbosity((SPxOut *)in_stack_fffffffffffffc58,local_2dc + 1);
            soplex::operator<<((SPxOut *)this_01,(char *)vec);
            SPxOut::setVerbosity(&in_RDI->spxout,local_2dc + 2);
          }
        }
        else {
          if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0xfffffffffffffff8) &&
             (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
            in_stack_fffffffffffffc60 = (SolRational *)&in_RDI->spxout;
            local_2cc[0] = SPxOut::getVerbosity((SPxOut *)in_stack_fffffffffffffc60);
            local_2d0 = INFO1;
            SPxOut::setVerbosity((SPxOut *)in_stack_fffffffffffffc60,&local_2d0);
            soplex::operator<<((SPxOut *)this_01,(char *)vec);
            SPxOut::setVerbosity(&in_RDI->spxout,local_2cc);
          }
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)this_01,vec);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *)this_01,vec);
          (in_RDI->_solRational).field_0xd0 = (in_RDI->_solRational).field_0xd0 & 0xfb | 4;
        }
      }
      else {
        if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0xfffffffffffffff8) &&
           (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
          in_stack_fffffffffffffc68 =
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&in_RDI->spxout;
          local_2cc[2] = SPxOut::getVerbosity((SPxOut *)in_stack_fffffffffffffc68);
          local_2cc[1] = 3;
          SPxOut::setVerbosity((SPxOut *)in_stack_fffffffffffffc68,local_2cc + 1);
          soplex::operator<<((SPxOut *)this_01,(char *)vec);
          SPxOut::setVerbosity(&in_RDI->spxout,local_2cc + 2);
        }
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)this_01,vec);
        (in_RDI->_solRational).field_0xd0 = (in_RDI->_solRational).field_0xd0 & 0xfd | 2;
      }
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~SolBase((SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)this_01);
    }
    _restoreBasis(this_01);
    if ((local_a5[0] & 1) != 0) {
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
        local_2dc[0] = SPxOut::getVerbosity(&in_RDI->spxout);
        local_2e0 = INFO1;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_2e0);
        soplex::operator<<((SPxOut *)this_01,(char *)vec);
        SPxOut::setVerbosity(&in_RDI->spxout,local_2dc);
      }
      in_RDI->_status = INFEASIBLE;
      break;
    }
    if ((local_31 & 1U) != 0) {
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
        local_2ec[2] = SPxOut::getVerbosity(&in_RDI->spxout);
        local_2ec[1] = 3;
        SPxOut::setVerbosity(&in_RDI->spxout,local_2ec + 1);
        soplex::operator<<((SPxOut *)this_01,(char *)vec);
        SPxOut::setVerbosity(&in_RDI->spxout,local_2ec + 2);
      }
      in_RDI->_status = UNBOUNDED;
      break;
    }
    if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0xfffffffffffffff8) &&
       (VVar3 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar3)) {
      local_2ec[0] = SPxOut::getVerbosity(&in_RDI->spxout);
      local_2f0 = INFO1;
      SPxOut::setVerbosity(&in_RDI->spxout,&local_2f0);
      soplex::operator<<((SPxOut *)this_01,(char *)vec);
      SPxOut::setVerbosity(&in_RDI->spxout,local_2ec);
    }
    bVar2 = _isSolveStopped((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                            in_stack_fffffffffffffc48,(bool *)in_stack_fffffffffffffc40);
  } while (((bVar2 ^ 0xffU) & 1) != 0);
  stat = (SPxStatus)((ulong)vec >> 0x20);
  init = (undefined1)((ulong)in_stack_fffffffffffffcc8 >> 0x38);
  in_RDI->_switchedToBoosted = false;
  in_RDI->_hasOldBasis = false;
  in_RDI->_hasOldFeasBasis = false;
  in_RDI->_hasOldUnbdBasis = false;
  if (((in_RDI->_status == OPTIMAL) || (in_RDI->_status == INFEASIBLE)) ||
     (in_RDI->_status == UNBOUNDED)) {
    in_RDI->_hasSolRational = true;
  }
  bVar2 = boolParam(in_RDI,EQTRANS);
  if (bVar2) {
    _untransformEquality(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  }
  setIntParam(in_stack_fffffffffffffcd8,(IntParam)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
              (int)in_stack_fffffffffffffcd0,(bool)init);
  setIntParam(in_stack_fffffffffffffcd8,(IntParam)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
              (int)in_stack_fffffffffffffcd0,(bool)init);
  bVar2 = boolParam(in_RDI,LIFTING);
  if (bVar2) {
    _project(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  _restoreLPReal(in_stack_fffffffffffffc40);
  if ((in_RDI->_hasBasis & 1U) != 0) {
    pSVar6 = &in_RDI->_solver;
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::get_const_ptr(&in_RDI->_basisStatusRows);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::get_const_ptr(&in_RDI->_basisStatusCols);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setBasis(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    this_00 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::basis(pSVar6);
    SVar4 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::status(this_00);
    in_RDI->_hasBasis = NO_PROBLEM < SVar4;
    SVar1 = in_RDI->_status;
    if (SVar1 == OPTIMAL) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasisStatus((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)this_01,stat);
    }
    else if (SVar1 == UNBOUNDED) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasisStatus((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)this_01,stat);
    }
    else if (SVar1 == INFEASIBLE) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setBasisStatus((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)this_01,stat);
    }
  }
  (*in_RDI->_statistics->initialPrecisionTime->_vptr_Timer[4])();
  (*in_RDI->_statistics->extendedPrecisionTime->_vptr_Timer[4])();
  (*in_RDI->_statistics->solvingTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SoPlexBase<R>::_optimizeRational(volatile bool* interrupt)
{
#ifndef SOPLEX_WITH_BOOST
   SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
   return;
#else
   bool hasUnboundedRay = false;
   bool infeasibilityNotCertified = false;
   bool unboundednessNotCertified = false;

   // start timing
   _statistics->solvingTime->start();
   _statistics->preprocessingTime->start();
   _statistics->initialPrecisionTime->start();

   // remember that last solve was rational
   _lastSolveMode = SOLVEMODE_RATIONAL;
   _resetBoostedPrecision();

   // ensure that the solver has the original problemo
   if(!_isRealLPLoaded)
   {
      assert(_realLP != &_solver);

      _solver.loadLP(*_realLP);
      spx_free(_realLP);
      _realLP = &_solver;
      _isRealLPLoaded = true;
   }
   // during the rational solve, we always store basis information in the basis arrays
   else if(_hasBasis)
   {
      _basisStatusRows.reSize(numRows());
      _basisStatusCols.reSize(numCols());
      _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), _basisStatusRows.size(),
                       _basisStatusCols.size());
   }

   // store objective, bounds, and sides of Real LP in case they will be modified during iterative refinement
   _storeLPReal();

   // deactivate objective limit in floating-point solver
   if(realParam(SoPlexBase<R>::OBJLIMIT_LOWER) > -realParam(SoPlexBase<R>::INFTY)
         || realParam(SoPlexBase<R>::OBJLIMIT_UPPER) < realParam(SoPlexBase<R>::INFTY))
   {
      SPX_MSG_INFO2(spxout, spxout << "Deactivating objective limit.\n");
   }

   _solver.setTerminationValue(realParam(SoPlexBase<R>::INFTY));

   _statistics->preprocessingTime->stop();

   // apply lifting to reduce range of nonzero matrix coefficients
   if(boolParam(SoPlexBase<R>::LIFTING))
      _lift();

   // force column representation
   ///@todo implement row objectives with row representation
   int oldRepresentation = intParam(SoPlexBase<R>::REPRESENTATION);
   setIntParam(SoPlexBase<R>::REPRESENTATION, SoPlexBase<R>::REPRESENTATION_COLUMN);

   // force ratio test (avoid bound flipping)
   int oldRatiotester = intParam(SoPlexBase<R>::RATIOTESTER);

   if(oldRatiotester == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING)
      setIntParam(SoPlexBase<R>::RATIOTESTER, SoPlexBase<R>::RATIOTESTER_FAST);

   ///@todo implement handling of row objectives in Cplex interface
#ifdef SOPLEX_WITH_CPX
   int oldEqtrans = boolParam(SoPlexBase<R>::EQTRANS);
   setBoolParam(SoPlexBase<R>::EQTRANS, true);
#endif

   // introduce slack variables to transform inequality constraints into equations
   if(boolParam(SoPlexBase<R>::EQTRANS))
      _transformEquality();

   _storedBasis = false;

   bool stoppedTime;
   bool stoppedIter;

   do
   {
      bool primalFeasible = false;
      bool dualFeasible = false;
      bool infeasible = false;
      bool unbounded = false;
      bool error = false;
      stoppedTime = false;
      stoppedIter = false;

      // indicate we are solving the original LP
      _switchToStandardMode();

      /// solve problem with iterative refinement and the right precision
      _performOptIRWrapper(_solRational, !unboundednessNotCertified, !infeasibilityNotCertified, 0,
                           primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error);

#ifdef SOPLEX_WITH_MPFR

      // case: an unrecoverable error occured, and precision boosting has reached its limit
      if(error && _boostingLimitReached)
      {
         _status = SPxSolverBase<R>::ERROR;
         break;
      }
      // case: an error occured, boost precision
      else if(error)
#else

      // case: an unrecoverable error occured, boost precision
      if(error)
#endif
      {
         _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

         if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
         {
            if(_setupBoostedSolverAfterRecovery())
               continue;
            else // precision boosting has reached its limit
               break;
         }
         else
            break;

#else
         break;
#endif
      }
      // case: stopped due to some limit
      else if(stoppedTime)
      {
         _status = SPxSolverBase<R>::ABORT_TIME;
         break;
      }
      else if(stoppedIter)
      {
         _status = SPxSolverBase<R>::ABORT_ITER;
         break;
      }
      // case: unboundedness detected for the first time
      else if(unbounded && !unboundednessNotCertified)
      {
         SolRational solUnbounded;

         // indicate we are testing unboundedness
         _switchToUnbdMode();

         _performUnboundedIRStable(solUnbounded, hasUnboundedRay, stoppedTime, stoppedIter, error);

         assert(!hasUnboundedRay || solUnbounded.hasPrimalRay());
         assert(!solUnbounded.hasPrimalRay() || hasUnboundedRay);

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for unboundedness.\n");
            _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }

         if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Dual infeasible.  Primal unbounded ray available.\n");
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Dual feasible.  Rejecting primal unboundedness.\n");
         }

         unboundednessNotCertified = !hasUnboundedRay;

         if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            break;
         }

         // indicate we are testing feasibility
         _switchToFeasMode();

         _performFeasIRStable(_solRational, infeasible, stoppedTime, stoppedIter, error);

         ///@todo this should be stored already earlier, possible switch use solRational above and solFeas here
         if(hasUnboundedRay)
         {
            _solRational._primalRay = solUnbounded._primalRay;
            _solRational._hasPrimalRay = true;
         }

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for feasibility.\n");
            _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }
         else if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            break;
         }
         else if(infeasible)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal infeasible.  Dual Farkas ray available.\n");
            _status = SPxSolverBase<R>::INFEASIBLE;
            break;
         }
         else if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and unbounded.\n");
            _status = SPxSolverBase<R>::UNBOUNDED;
            break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and bounded.\n");
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }

#endif
            continue;
         }
      }
      // case: infeasibility detected
      else if(infeasible && !infeasibilityNotCertified)
      {
         _storeBasis();

         // indicate we are testing feasibility
         _switchToFeasMode();

         _performFeasIRStable(_solRational, infeasible, stoppedTime, stoppedIter, error);

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for infeasibility.\n");
            _status = SPxSolverBase<R>::ERROR;
            _restoreBasis();
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }

         infeasibilityNotCertified = !infeasible;

         if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            _restoreBasis();
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            _restoreBasis();
            break;
         }

         if(infeasible && boolParam(SoPlexBase<R>::TESTDUALINF))
         {
            SolRational solUnbounded;

            // indicate we are testing unboundedness
            // not sure about this.
            _switchToUnbdMode();

            _performUnboundedIRStable(solUnbounded, hasUnboundedRay, stoppedTime, stoppedIter, error);

            assert(!hasUnboundedRay || solUnbounded.hasPrimalRay());
            assert(!solUnbounded.hasPrimalRay() || hasUnboundedRay);

            if(error)
            {
               SPX_MSG_INFO1(spxout, spxout << "Error while testing for dual infeasibility.\n");
               _status = SPxSolverBase<R>::ERROR;
               _restoreBasis();
#ifdef SOPLEX_WITH_MPFR

               if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
               {
                  if(_setupBoostedSolverAfterRecovery())
                     continue;
                  else // precision boosting has reached its limit
                     break;
               }
               else
                  break;

#else
               break;
#endif
            }

            if(hasUnboundedRay)
            {
               SPX_MSG_INFO1(spxout, spxout << "Dual infeasible.  Primal unbounded ray available.\n");
               _solRational._primalRay = solUnbounded._primalRay;
               _solRational._hasPrimalRay = true;
            }
            else if(solUnbounded._isDualFeasible)
            {
               SPX_MSG_INFO1(spxout, spxout << "Dual feasible.  Storing dual multipliers.\n");
               _solRational._dual = solUnbounded._dual;
               _solRational._redCost = solUnbounded._redCost;
               _solRational._isDualFeasible = true;
            }
            else
            {
               assert(false);
               SPX_MSG_INFO1(spxout, spxout << "Not dual infeasible.\n");
            }
         }

         _restoreBasis();

         if(infeasible)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal infeasible.  Dual Farkas ray available.\n");
            _status = SPxSolverBase<R>::INFEASIBLE;
            break;
         }
         else if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and unbounded.\n");
            _status = SPxSolverBase<R>::UNBOUNDED;
            break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible.  Optimizing again.\n");
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }

#endif
            continue;
         }
      }
      else if(primalFeasible && dualFeasible)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solved to optimality.\n");
         _status = SPxSolverBase<R>::OPTIMAL;
         break;
      }
      else
      {
#ifdef SOPLEX_WITH_MPFR

         if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
         {
            if(_setupBoostedSolverAfterRecovery())
               continue;
            else // precision boosting has reached its limit
               break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Terminating without success.\n");
            break;
         }

#else
         SPX_MSG_INFO1(spxout, spxout << "Terminating without success.\n");
         break;
#endif
      }
   }
   while(!_isSolveStopped(stoppedTime, stoppedIter));

   // reset old basis flags for future optimization runs
   _switchedToBoosted = false;
   _hasOldBasis = false;
   _hasOldFeasBasis = false;
   _hasOldUnbdBasis = false;

   ///@todo set status to ABORT_VALUE if optimal solution exceeds objective limit

   if(_status == SPxSolverBase<R>::OPTIMAL || _status == SPxSolverBase<R>::INFEASIBLE
         || _status == SPxSolverBase<R>::UNBOUNDED)
      _hasSolRational = true;

   // restore original problem
   if(boolParam(SoPlexBase<R>::EQTRANS))
      _untransformEquality(_solRational);

#ifdef SOPLEX_WITH_CPX
   setBoolParam(SoPlexBase<R>::EQTRANS, oldEqtrans);
#endif

   // reset representation and ratio test
   setIntParam(SoPlexBase<R>::REPRESENTATION, oldRepresentation);
   setIntParam(SoPlexBase<R>::RATIOTESTER, oldRatiotester);

   // undo lifting
   if(boolParam(SoPlexBase<R>::LIFTING))
      _project(_solRational);

   // restore objective, bounds, and sides of Real LP in case they have been modified during iterative refinement
   _restoreLPReal();

   // since the Real LP is loaded in the solver, we need to also pass the basis information to the solver if
   // available
   if(_hasBasis)
   {
      assert(_isRealLPLoaded);
      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);

      // since setBasis always sets the basis status to regular, we need to set it manually here
      switch(_status)
      {
      case SPxSolverBase<R>::OPTIMAL:
         _solver.setBasisStatus(SPxBasisBase<R>::OPTIMAL);
         break;

      case SPxSolverBase<R>::INFEASIBLE:
         _solver.setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
         break;

      case SPxSolverBase<R>::UNBOUNDED:
         _solver.setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
         break;

      default:
         break;
      }

   }

   // stop timing
   _statistics->initialPrecisionTime->stop();
   _statistics->extendedPrecisionTime->stop();
   _statistics->solvingTime->stop();
#endif
}

/// perform iterative refinement using the right precision
template <class R>
void SoPlexBase<R>::_performOptIRWrapper(
   SolRational& sol,
   bool acceptUnbounded,
   bool acceptInfeasible,
   int minIRRoundsRemaining,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error
)
{
   _solver.setSolvingForBoosted(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));
   _boostedSolver.setSolvingForBoosted(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));

#ifdef SOPLEX_WITH_MPFR

   if(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT))
   {
      // no precision boosting or initial precision -> solve with plain iterative refinement
      if(!boolParam(SoPlexBase<R>::PRECISION_BOOSTING) || !_switchedToBoosted)
      {
         _performOptIRStable(sol, acceptUnbounded, acceptInfeasible, minIRRoundsRemaining,
                             primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error);
      }
      else
      {
         do
         {
            // setup boosted solver for the new iteration
            _setupBoostedSolver();
            // solve problem with iterative refinement and recovery mechanism, using multiprecision
            // return false if a new boosted iteration is needed, true otherwise
            bool needNewBoostedIt;
            _performOptIRStableBoosted(sol, acceptUnbounded, acceptInfeasible, minIRRoundsRemaining,
                                       primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error,
                                       needNewBoostedIt);

            // update statistics for precision boosting
            _updateBoostingStatistics();

            // boost precision if no success
            if(needNewBoostedIt)
            {
               if(!_boostPrecision())
               {
                  // error message already displayed
                  error = true;
                  break;
               }
            }
            else
               break;
         }
         while(true);
      }